

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O3

problem * baryonyx::unpreprocess(problem *__return_storage_ptr__,context *ctx,raw_problem *raw_pb)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  size_t sVar4;
  tuple<double,_baryonyx::show_size_type> *mem;
  undefined1 auVar5 [16];
  undefined1 in_ZMM0 [64];
  string local_50;
  uint local_30 [2];
  double local_28;
  
  auVar5 = in_ZMM0._0_16_;
  sVar4 = memory_consumed(raw_pb);
  auVar5 = vcvtusi2sd_avx512f(auVar5,sVar4);
  local_30[0] = 0;
  dVar1 = auVar5._0_8_ * 0.0009765625;
  dVar2 = dVar1 * 0.0009765625;
  local_28 = dVar2 * 0.0009765625;
  if ((dVar2 * 0.0009765625 <= 0.5) && (local_30[0] = 1, local_28 = dVar2, dVar2 <= 0.5)) {
    bVar3 = 0.5 < dVar1;
    local_30[0] = bVar3 ^ 3;
    local_28 = (double)((ulong)bVar3 * (long)dVar1 + (ulong)!bVar3 * (long)auVar5._0_8_);
  }
  to_string_abi_cxx11_(&local_50,(baryonyx *)local_30,mem);
  info<std::__cxx11::string>(ctx,"- Unprepossessing starts (size: {})\n",&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  problem::problem(__return_storage_ptr__,raw_pb);
  return __return_storage_ptr__;
}

Assistant:

problem
unpreprocess(const context& ctx, const raw_problem& raw_pb)
{
    info(ctx,
         "- Unprepossessing starts (size: {})\n",
         to_string(memory_consumed_size(memory_consumed(raw_pb))));

    return problem(raw_pb);
}